

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_csv_state.cpp
# Opt level: O1

void duckdb::FillScanErrorTable
               (InternalAppender *scan_appender,idx_t scan_idx,idx_t file_idx,CSVFileScan *file)

{
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string_t value;
  string_t value_00;
  string_t value_01;
  string_t value_02;
  string_t value_03;
  string_t value_04;
  string_t value_05;
  string_t value_06;
  string_t value_07;
  bool bVar3;
  uint value_08;
  const_reference pvVar4;
  ostream *poVar5;
  const_reference this_00;
  mapped_type *pmVar6;
  size_type __n;
  StrpTimeFormat date_format;
  string parameters;
  StrpTimeFormat timestamp_format;
  ostringstream columns;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  uint local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  uint local_4c8;
  undefined4 uStack_4c4;
  undefined4 uStack_4c0;
  undefined4 uStack_4bc;
  uint local_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  uint local_4a8;
  undefined4 uStack_4a4;
  undefined4 uStack_4a0;
  undefined4 uStack_49c;
  uint local_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  uint local_488;
  undefined4 uStack_484;
  undefined4 uStack_480;
  undefined4 uStack_47c;
  uint local_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  uint local_468;
  undefined4 uStack_464;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  CSVReaderOptions *local_458;
  vector<duckdb::LogicalType,_true> *local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_448;
  undefined1 local_440 [8];
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400 [24];
  idx_t local_3e8;
  vector<int,_std::allocator<int>_> local_3e0;
  LogicalType local_3c8;
  LogicalType local_3b0;
  LogicalType local_398;
  string local_380;
  undefined1 local_360 [8];
  _Alloc_hider local_358;
  uint local_350;
  char local_348 [16];
  vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_> local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320 [24];
  idx_t local_308;
  vector<int,_std::allocator<int>_> local_300;
  Value local_2e8;
  Value local_2a8;
  Value local_268;
  string local_228 [3];
  ios_base local_1b8 [264];
  Value local_b0;
  Value local_70;
  
  BaseAppender::BeginRow(&scan_appender->super_BaseAppender);
  BaseAppender::Append<unsigned_long>(&scan_appender->super_BaseAppender,scan_idx);
  BaseAppender::Append<unsigned_long>(&scan_appender->super_BaseAppender,file_idx);
  pcVar2 = (file->super_BaseFileReader).file.path._M_dataplus._M_p;
  local_468 = (uint)(file->super_BaseFileReader).file.path._M_string_length;
  if (local_468 < 0xd) {
    uStack_45c = 0;
    uStack_464 = 0;
    uStack_460 = 0;
    if (local_468 != 0) {
      switchD_015ff80e::default(&uStack_464,pcVar2,(ulong)(local_468 & 0xf));
    }
  }
  else {
    uStack_464 = *(undefined4 *)pcVar2;
    uStack_460 = SUB84(pcVar2,0);
    uStack_45c = (undefined4)((ulong)pcVar2 >> 0x20);
  }
  value_07.value._4_1_ = (undefined1)uStack_464;
  value_07.value._5_1_ = uStack_464._1_1_;
  value_07.value._6_1_ = uStack_464._2_1_;
  value_07.value._7_1_ = uStack_464._3_1_;
  value_07.value.pointer.length = local_468;
  value_07.value._8_4_ = uStack_460;
  value_07.value._12_4_ = uStack_45c;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_07);
  paVar1 = &local_228[0].field_2;
  pcVar2 = (file->options).dialect_options.state_machine_options.delimiter.value._M_dataplus._M_p;
  local_228[0]._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,pcVar2,
             pcVar2 + (file->options).dialect_options.state_machine_options.delimiter.value.
                      _M_string_length);
  local_478 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_46c = 0;
    uStack_474 = 0;
    uStack_470 = 0;
    if ((uint)local_228[0]._M_string_length != 0) {
      switchD_015ff80e::default
                (&uStack_474,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
    }
  }
  else {
    uStack_474 = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_470 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_46c = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
  }
  value_06.value._4_1_ = (undefined1)uStack_474;
  value_06.value._5_1_ = uStack_474._1_1_;
  value_06.value._6_1_ = uStack_474._2_1_;
  value_06.value._7_1_ = uStack_474._3_1_;
  value_06.value.pointer.length = local_478;
  value_06.value._8_4_ = uStack_470;
  value_06.value._12_4_ = uStack_46c;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_06);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  CSVOption<char>::FormatValueInternal_abi_cxx11_
            (local_228,&(file->options).dialect_options.state_machine_options.quote,
             &(file->options).dialect_options.state_machine_options.quote.value);
  local_488 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_47c = 0;
    uStack_484 = 0;
    uStack_480 = 0;
    if ((uint)local_228[0]._M_string_length != 0) {
      switchD_015ff80e::default
                (&uStack_484,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
    }
  }
  else {
    uStack_484 = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_480 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_47c = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
  }
  value_05.value._4_1_ = (undefined1)uStack_484;
  value_05.value._5_1_ = uStack_484._1_1_;
  value_05.value._6_1_ = uStack_484._2_1_;
  value_05.value._7_1_ = uStack_484._3_1_;
  value_05.value.pointer.length = local_488;
  value_05.value._8_4_ = uStack_480;
  value_05.value._12_4_ = uStack_47c;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_05);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  CSVOption<char>::FormatValueInternal_abi_cxx11_
            (local_228,&(file->options).dialect_options.state_machine_options.escape,
             &(file->options).dialect_options.state_machine_options.escape.value);
  local_498 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_48c = 0;
    uStack_494 = 0;
    uStack_490 = 0;
    if ((uint)local_228[0]._M_string_length != 0) {
      switchD_015ff80e::default
                (&uStack_494,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
    }
  }
  else {
    uStack_494 = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_490 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_48c = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
  }
  value_04.value._4_1_ = (undefined1)uStack_494;
  value_04.value._5_1_ = uStack_494._1_1_;
  value_04.value._6_1_ = uStack_494._2_1_;
  value_04.value._7_1_ = uStack_494._3_1_;
  value_04.value.pointer.length = local_498;
  value_04.value._8_4_ = uStack_490;
  value_04.value._12_4_ = uStack_48c;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_04);
  local_458 = &file->options;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  CSVReaderOptions::NewLineIdentifierToString_abi_cxx11_(local_228,local_458);
  local_4a8 = (uint)local_228[0]._M_string_length;
  if ((uint)local_228[0]._M_string_length < 0xd) {
    uStack_49c = 0;
    uStack_4a4 = 0;
    uStack_4a0 = 0;
    if ((uint)local_228[0]._M_string_length != 0) {
      switchD_015ff80e::default
                (&uStack_4a4,local_228[0]._M_dataplus._M_p,
                 (ulong)((uint)local_228[0]._M_string_length & 0xf));
    }
  }
  else {
    uStack_4a4 = *(undefined4 *)local_228[0]._M_dataplus._M_p;
    uStack_4a0 = SUB84(local_228[0]._M_dataplus._M_p,0);
    uStack_49c = (undefined4)((ulong)local_228[0]._M_dataplus._M_p >> 0x20);
  }
  value_03.value._4_1_ = (undefined1)uStack_4a4;
  value_03.value._5_1_ = uStack_4a4._1_1_;
  value_03.value._6_1_ = uStack_4a4._2_1_;
  value_03.value._7_1_ = uStack_4a4._3_1_;
  value_03.value.pointer.length = local_4a8;
  value_03.value._8_4_ = uStack_4a0;
  value_03.value._12_4_ = uStack_49c;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_228[0]._M_dataplus._M_p);
  }
  value_08 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                       ((file->options).dialect_options.skip_rows.value);
  Value::UINTEGER(&local_70,value_08);
  BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_70);
  Value::~Value(&local_70);
  Value::BOOLEAN(&local_b0,(file->options).dialect_options.header.value);
  BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_b0);
  Value::~Value(&local_b0);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"{",1);
  if ((file->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (file->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_450 = &file->types;
    local_448 = &file->names;
    __n = 0;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\'",1);
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](local_448,__n);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_228,(pvVar4->_M_dataplus)._M_p,pvVar4->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\': \'",4);
      this_00 = vector<duckdb::LogicalType,_true>::operator[](local_450,__n);
      LogicalType::ToString_abi_cxx11_((string *)local_440,this_00);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_440,(long)local_438._M_p);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
      if (local_440 != (undefined1  [8])&local_430) {
        operator_delete((void *)local_440);
      }
      if (__n != ((long)(file->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(file->types).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1U)
      {
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,",",1);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(file->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(file->types).
                                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  .
                                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"}",1);
  ::std::__cxx11::stringbuf::str();
  local_4b8 = (uint)local_438._M_p;
  if ((uint)local_438._M_p < 0xd) {
    uStack_4ac = 0;
    uStack_4b4 = 0;
    uStack_4b0 = 0;
    if ((uint)local_438._M_p != 0) {
      switchD_015ff80e::default(&uStack_4b4,(void *)local_440,(ulong)((uint)local_438._M_p & 0xf));
    }
  }
  else {
    uStack_4b4 = *(undefined4 *)local_440;
    uStack_4b0 = local_440._0_4_;
    uStack_4ac = local_440._4_4_;
  }
  value_02.value._4_1_ = (undefined1)uStack_4b4;
  value_02.value._5_1_ = uStack_4b4._1_1_;
  value_02.value._6_1_ = uStack_4b4._2_1_;
  value_02.value._7_1_ = uStack_4b4._3_1_;
  value_02.value.pointer.length = local_4b8;
  value_02.value._8_4_ = uStack_4b0;
  value_02.value._12_4_ = uStack_4ac;
  BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_02);
  if (local_440 != (undefined1  [8])&local_430) {
    operator_delete((void *)local_440);
  }
  this = &(file->options).dialect_options.date_format;
  pmVar6 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::operator[](this,&LogicalType::DATE);
  local_440 = (undefined1  [8])&PTR__StrTimeFormat_024942f0;
  local_438._M_p = local_430._M_local_buf + 8;
  pcVar2 = (pmVar6->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,pcVar2,
             pcVar2 + (pmVar6->value).super_StrTimeFormat.format_specifier._M_string_length);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            (&local_418,
             &(pmVar6->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_400,
           &(pmVar6->value).super_StrTimeFormat.literals.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_3e8 = (pmVar6->value).super_StrTimeFormat.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_3e0,
             &(pmVar6->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>);
  local_440 = (undefined1  [8])&PTR__StrTimeFormat_02494368;
  bVar3 = StrTimeFormat::Empty((StrTimeFormat *)local_440);
  if (bVar3) {
    LogicalType::LogicalType(&local_398,SQLNULL);
    Value::Value(&local_268,&local_398);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_268);
    Value::~Value(&local_268);
    LogicalType::~LogicalType(&local_398);
  }
  else {
    local_4c8 = local_430._M_allocated_capacity._0_4_;
    if ((uint)local_430._0_4_ < 0xd) {
      uStack_4bc = 0;
      uStack_4c4 = 0;
      uStack_4c0 = 0;
      if (local_430._M_allocated_capacity._0_4_ != 0) {
        switchD_015ff80e::default
                  (&uStack_4c4,local_438._M_p,(ulong)(local_430._M_allocated_capacity._0_4_ & 0xf));
      }
    }
    else {
      uStack_4c4 = *(undefined4 *)local_438._M_p;
      uStack_4c0 = SUB84(local_438._M_p,0);
      uStack_4bc = (undefined4)((ulong)local_438._M_p >> 0x20);
    }
    value_01.value._4_1_ = (undefined1)uStack_4c4;
    value_01.value._5_1_ = uStack_4c4._1_1_;
    value_01.value._6_1_ = uStack_4c4._2_1_;
    value_01.value._7_1_ = uStack_4c4._3_1_;
    value_01.value.pointer.length = local_4c8;
    value_01.value._8_4_ = uStack_4c0;
    value_01.value._12_4_ = uStack_4bc;
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_01);
  }
  pmVar6 = ::std::
           map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
           ::operator[](this,&LogicalType::TIMESTAMP);
  local_360 = (undefined1  [8])&PTR__StrTimeFormat_024942f0;
  local_358._M_p = local_348;
  pcVar2 = (pmVar6->value).super_StrTimeFormat.format_specifier._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,pcVar2,
             pcVar2 + (pmVar6->value).super_StrTimeFormat.format_specifier._M_string_length);
  ::std::vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>::vector
            (&local_338,
             &(pmVar6->value).super_StrTimeFormat.specifiers.
              super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_320,
           &(pmVar6->value).super_StrTimeFormat.literals.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_308 = (pmVar6->value).super_StrTimeFormat.constant_size;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_300,
             &(pmVar6->value).super_StrTimeFormat.numeric_width.
              super_vector<int,_std::allocator<int>_>);
  local_360 = (undefined1  [8])&PTR__StrTimeFormat_02494368;
  bVar3 = StrTimeFormat::Empty((StrTimeFormat *)local_360);
  if (bVar3) {
    LogicalType::LogicalType(&local_3b0,SQLNULL);
    Value::Value(&local_2a8,&local_3b0);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_2a8);
    Value::~Value(&local_2a8);
    LogicalType::~LogicalType(&local_3b0);
  }
  else {
    local_4d8 = local_350;
    if (local_350 < 0xd) {
      uStack_4cc = 0;
      uStack_4d4 = 0;
      uStack_4d0 = 0;
      if (local_350 != 0) {
        switchD_015ff80e::default(&uStack_4d4,local_358._M_p,(ulong)(local_350 & 0xf));
      }
    }
    else {
      uStack_4d4 = *(undefined4 *)local_358._M_p;
      uStack_4d0 = SUB84(local_358._M_p,0);
      uStack_4cc = (undefined4)((ulong)local_358._M_p >> 0x20);
    }
    value_00.value._4_1_ = (undefined1)uStack_4d4;
    value_00.value._5_1_ = uStack_4d4._1_1_;
    value_00.value._6_1_ = uStack_4d4._2_1_;
    value_00.value._7_1_ = uStack_4d4._3_1_;
    value_00.value.pointer.length = local_4d8;
    value_00.value._8_4_ = uStack_4d0;
    value_00.value._12_4_ = uStack_4cc;
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value_00);
  }
  if ((file->options).user_defined_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)
  {
    LogicalType::LogicalType(&local_3c8,SQLNULL);
    Value::Value(&local_2e8,&local_3c8);
    BaseAppender::Append<duckdb::Value>(&scan_appender->super_BaseAppender,&local_2e8);
    Value::~Value(&local_2e8);
    LogicalType::~LogicalType(&local_3c8);
  }
  else {
    CSVReaderOptions::GetUserDefinedParameters_abi_cxx11_(&local_380,local_458);
    if ((uint)local_380._M_string_length < 0xd) {
      uStack_4dc = 0;
      uStack_4e4 = 0;
      uStack_4e0 = 0;
      if ((uint)local_380._M_string_length != 0) {
        switchD_015ff80e::default
                  (&uStack_4e4,local_380._M_dataplus._M_p,
                   (ulong)((uint)local_380._M_string_length & 0xf));
      }
    }
    else {
      uStack_4e4 = *(undefined4 *)local_380._M_dataplus._M_p;
      uStack_4e0 = SUB84(local_380._M_dataplus._M_p,0);
      uStack_4dc = (undefined4)((ulong)local_380._M_dataplus._M_p >> 0x20);
    }
    value.value._4_1_ = (undefined1)uStack_4e4;
    value.value._5_1_ = uStack_4e4._1_1_;
    value.value._6_1_ = uStack_4e4._2_1_;
    value.value._7_1_ = uStack_4e4._3_1_;
    value.value.pointer.length = (uint)local_380._M_string_length;
    value.value._8_4_ = uStack_4e0;
    value.value._12_4_ = uStack_4dc;
    BaseAppender::Append<duckdb::string_t>(&scan_appender->super_BaseAppender,value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p);
    }
  }
  BaseAppender::EndRow(&scan_appender->super_BaseAppender);
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_360);
  StrTimeFormat::~StrTimeFormat((StrTimeFormat *)local_440);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  ::std::ios_base::~ios_base(local_1b8);
  return;
}

Assistant:

void FillScanErrorTable(InternalAppender &scan_appender, idx_t scan_idx, idx_t file_idx, CSVFileScan &file) {
	CSVReaderOptions &options = file.options;
	// Add the row to the rejects table
	scan_appender.BeginRow();
	// 1. Scan Idx
	scan_appender.Append(scan_idx);
	// 2. File Idx
	scan_appender.Append(file_idx);
	// 3. File Path
	scan_appender.Append(string_t(file.GetFileName()));
	// 4. Delimiter
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.delimiter.FormatValue()));
	// 5. Quote
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.quote.FormatValue()));
	// 6. Escape
	scan_appender.Append(string_t(options.dialect_options.state_machine_options.escape.FormatValue()));
	// 7. NewLine Delimiter
	scan_appender.Append(string_t(options.NewLineIdentifierToString()));
	// 8. Skip Rows
	scan_appender.Append(Value::UINTEGER(NumericCast<uint32_t>(options.dialect_options.skip_rows.GetValue())));
	// 9. Has Header
	scan_appender.Append(Value::BOOLEAN(options.dialect_options.header.GetValue()));

	auto &types = file.GetTypes();
	auto &names = file.GetNames();

	// 10. List<Struct<Column-Name:Types>> {'col1': 'INTEGER', 'col2': 'VARCHAR'}
	std::ostringstream columns;
	columns << "{";
	for (idx_t i = 0; i < types.size(); i++) {
		columns << "'" << names[i] << "': '" << types[i].ToString() << "'";
		if (i != types.size() - 1) {
			columns << ",";
		}
	}
	columns << "}";
	scan_appender.Append(string_t(columns.str()));
	// 11. Date Format
	auto date_format = options.dialect_options.date_format[LogicalType::DATE].GetValue();
	if (!date_format.Empty()) {
		scan_appender.Append(string_t(date_format.format_specifier));
	} else {
		scan_appender.Append(Value());
	}

	// 12. Timestamp Format
	auto timestamp_format = options.dialect_options.date_format[LogicalType::TIMESTAMP].GetValue();
	if (!timestamp_format.Empty()) {
		scan_appender.Append(string_t(timestamp_format.format_specifier));
	} else {
		scan_appender.Append(Value());
	}

	// 13. The Extra User Arguments
	if (options.user_defined_parameters.empty()) {
		scan_appender.Append(Value());
	} else {
		auto parameters = options.GetUserDefinedParameters();
		scan_appender.Append(string_t(parameters));
	}
	// Finish the row to the rejects table
	scan_appender.EndRow();
}